

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

string * libaom_examples::(anonymous_namespace)::format_color_properties_abi_cxx11_
                   (pair<libaom_examples::ColorProperties,_bool> *color_properties)

{
  byte *in_RSI;
  string *in_RDI;
  char *in_stack_fffffffffffffed0;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_e8 [4];
  int in_stack_ffffffffffffff1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [55];
  allocator local_11;
  byte *local_10;
  
  if ((in_RSI[4] & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"absent",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    __lhs = &local_c8;
    local_10 = in_RSI;
    std::__cxx11::to_string(in_stack_ffffffffffffff1c);
    std::operator+(__lhs,in_stack_fffffffffffffed0);
    std::__cxx11::to_string(in_stack_ffffffffffffff1c);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(__lhs,in_stack_fffffffffffffed0);
    std::__cxx11::to_string(in_stack_ffffffffffffff1c);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if ((*local_10 & 1) == 0) {
      __rhs = "L";
    }
    else {
      __rhs = "F";
    }
    std::operator+(__lhs,__rhs);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return in_RDI;
}

Assistant:

std::string format_color_properties(
    const std::pair<ColorProperties, bool> &color_properties) {
  if (!color_properties.second) {
    return "absent";
  } else {
    return std::to_string(color_properties.first.color_primaries) + "/" +
           std::to_string(color_properties.first.transfer_characteristics) +
           "/" + std::to_string(color_properties.first.matrix_coefficients) +
           (color_properties.first.color_range ? "F" : "L");
  }
}